

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalTypeOptimization.cpp
# Opt level: O3

void __thiscall
wasm::(anonymous_namespace)::GlobalTypeOptimization::updateTypes(wasm::Module&)::TypeRewriter::
modifyStruct(wasm::HeapType,wasm::Struct__(void *this,HeapType oldStructType,Struct *struct_)

{
  long lVar1;
  long lVar2;
  _Hash_node_base *p_Var3;
  char *pcVar4;
  PackedType PVar5;
  Mutability MVar6;
  iterator iVar7;
  Mutability *pMVar8;
  iterator iVar9;
  iterator iVar10;
  mapped_type *pmVar11;
  mapped_type *pmVar12;
  pointer pFVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  __node_base _Var17;
  pointer pFVar18;
  ulong uVar19;
  __hash_code __code;
  _Hash_node_base *p_Var20;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *__ht;
  undefined1 local_80 [8];
  unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
  oldFieldNames;
  HeapType oldStructType_local;
  uint uStack_38;
  value_type newIndex;
  __alloc_node_gen_t __alloc_node_gen;
  
  oldFieldNames._M_h._M_single_bucket = (__node_base_ptr)oldStructType.id;
  iVar7 = std::
          _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)(*(long *)((long)this + 0x68) + 0x68),
                 (key_type *)&oldFieldNames._M_h._M_single_bucket);
  lVar1 = *(long *)((long)this + 0x68);
  if (iVar7.
      super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    lVar2 = *(long *)((long)iVar7.
                            super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_true>
                            ._M_cur + 0x10);
    uVar15 = (*(long *)((long)iVar7.
                              super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_true>
                              ._M_cur + 0x20) - lVar2) * 8 +
             (ulong)*(uint *)((long)iVar7.
                                    super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_true>
                                    ._M_cur + 0x28);
    if (uVar15 != 0) {
      pMVar8 = &((struct_->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                 _M_impl.super__Vector_impl_data._M_start)->mutable_;
      uVar16 = 0;
      do {
        if ((*(ulong *)(lVar2 + (uVar16 >> 6 & 0x3ffffff) * 8) >> (uVar16 & 0x3f) & 1) != 0) {
          *pMVar8 = Immutable;
        }
        uVar16 = uVar16 + 1;
        pMVar8 = pMVar8 + 4;
      } while ((uVar16 & 0xffffffff) < uVar15);
    }
  }
  iVar9 = std::
          _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)(lVar1 + 0xa0),(key_type *)&oldFieldNames._M_h._M_single_bucket);
  if (iVar9.
      super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    pFVar13 = (struct_->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pFVar18 = (struct_->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    uVar15 = 0;
    if (pFVar18 == pFVar13) {
      uVar16 = 0;
    }
    else {
      uVar14 = 1;
      uVar19 = 0;
      do {
        uVar16 = (ulong)*(uint *)(*(long *)((long)iVar9.
                                                  super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true>
                                                  ._M_cur + 0x10) + uVar19 * 4);
        if (uVar16 == 0xffffffff) {
          uVar15 = (ulong)((int)uVar15 + 1);
        }
        else {
          pFVar18 = pFVar13 + uVar19;
          PVar5 = pFVar18->packedType;
          MVar6 = pFVar18->mutable_;
          pFVar13 = pFVar13 + uVar16;
          (pFVar13->type).id = (pFVar18->type).id;
          pFVar13->packedType = PVar5;
          pFVar13->mutable_ = MVar6;
          pFVar13 = (struct_->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pFVar18 = (struct_->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        }
        uVar19 = (ulong)uVar14;
        uVar16 = (long)pFVar18 - (long)pFVar13 >> 4;
        uVar14 = uVar14 + 1;
      } while (uVar19 < uVar16);
    }
    std::vector<wasm::Field,_std::allocator<wasm::Field>_>::resize(&struct_->fields,uVar16 - uVar15)
    ;
    iVar10 = std::
             _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)(*(long *)((long)this + 8) + 0x120),
                    (key_type *)&oldFieldNames._M_h._M_single_bucket);
    if (iVar10.super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>.
        _M_cur != (__node_type *)0x0) {
      __ht = (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              *)((long)iVar10.
                       super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                       ._M_cur + 0x20);
      p_Var20 = (_Hash_node_base *)0x0;
      local_80 = (undefined1  [8])0x0;
      oldFieldNames._M_h._M_buckets =
           *(__buckets_ptr *)
            ((long)iVar10.
                   super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                   ._M_cur + 0x28);
      oldFieldNames._M_h._M_bucket_count = 0;
      oldFieldNames._M_h._M_before_begin._M_nxt =
           *(_Hash_node_base **)
            ((long)iVar10.
                   super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                   ._M_cur + 0x38);
      oldFieldNames._M_h._M_element_count =
           *(size_type *)
            ((long)iVar10.
                   super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                   ._M_cur + 0x40);
      oldFieldNames._M_h._M_rehash_policy._0_8_ =
           *(undefined8 *)
            ((long)iVar10.
                   super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                   ._M_cur + 0x48);
      oldFieldNames._M_h._M_rehash_policy._M_next_resize = 0;
      _uStack_38 = (__hashtable_alloc *)local_80;
      std::
      _Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_assign<std::_Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<unsigned_int_const,wasm::Name>,false>>>>
                ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)local_80,__ht,
                 (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_wasm::Name>,_false>_>_>
                  *)&stack0xffffffffffffffc8);
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::clear(__ht);
      _uStack_38 = _uStack_38 & 0xffffffff00000000;
      _Var17 = oldFieldNames._M_h._M_before_begin;
      if (oldFieldNames._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
        do {
          oldStructType_local.id._4_4_ =
               *(int *)(*(long *)((long)iVar9.
                                        super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true>
                                        ._M_cur + 0x10) + (long)p_Var20 * 4);
          if (oldStructType_local.id._4_4_ != -1) {
            if (*(__buckets_ptr)
                 ((long)local_80 + ((ulong)p_Var20 % (ulong)oldFieldNames._M_h._M_buckets) * 8) !=
                (__node_base_ptr)0x0) {
              p_Var3 = (*(__buckets_ptr)
                         ((long)local_80 +
                         ((ulong)p_Var20 % (ulong)oldFieldNames._M_h._M_buckets) * 8))->_M_nxt;
              uVar14 = *(uint *)&p_Var3[1]._M_nxt;
              while ((uint)p_Var20 != uVar14) {
                p_Var3 = p_Var3->_M_nxt;
                if ((p_Var3 == (_Hash_node_base *)0x0) ||
                   (uVar14 = *(uint *)&p_Var3[1]._M_nxt,
                   (ulong)uVar14 % (ulong)oldFieldNames._M_h._M_buckets !=
                   (ulong)p_Var20 % (ulong)oldFieldNames._M_h._M_buckets)) goto LAB_00715148;
              }
              pmVar11 = std::__detail::
                        _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)local_80,(key_type *)&stack0xffffffffffffffc8);
              if ((pmVar11->super_IString).str._M_str == (char *)0x0) {
                __assert_fail("oldFieldNames[i].is()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/GlobalTypeOptimization.cpp"
                              ,0x133,
                              "virtual void wasm::(anonymous namespace)::GlobalTypeOptimization::updateTypes(Module &)::TypeRewriter::modifyStruct(HeapType, Struct &)"
                             );
              }
              pmVar11 = std::__detail::
                        _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)local_80,(key_type *)&stack0xffffffffffffffc8);
              pmVar12 = std::__detail::
                        _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)__ht,(key_type *)((long)&oldStructType_local.id + 4));
              pcVar4 = (pmVar11->super_IString).str._M_str;
              (pmVar12->super_IString).str._M_len = (pmVar11->super_IString).str._M_len;
              (pmVar12->super_IString).str._M_str = pcVar4;
              p_Var20 = (_Hash_node_base *)((ulong)_uStack_38 & 0xffffffff);
              _Var17 = oldFieldNames._M_h._M_before_begin;
            }
          }
LAB_00715148:
          uVar14 = (int)p_Var20 + 1;
          p_Var20 = (_Hash_node_base *)(ulong)uVar14;
          uStack_38 = uVar14;
        } while (p_Var20 < _Var17._M_nxt);
      }
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_80);
    }
  }
  return;
}

Assistant:

void modifyStruct(HeapType oldStructType, Struct& struct_) override {
        auto& newFields = struct_.fields;

        // Adjust immutability.
        auto immIter = parent.canBecomeImmutable.find(oldStructType);
        if (immIter != parent.canBecomeImmutable.end()) {
          auto& immutableVec = immIter->second;
          for (Index i = 0; i < immutableVec.size(); i++) {
            if (immutableVec[i]) {
              newFields[i].mutable_ = Immutable;
            }
          }
        }

        // Remove fields where we can.
        auto remIter = parent.indexesAfterRemovals.find(oldStructType);
        if (remIter != parent.indexesAfterRemovals.end()) {
          auto& indexesAfterRemoval = remIter->second;
          Index removed = 0;
          for (Index i = 0; i < newFields.size(); i++) {
            auto newIndex = indexesAfterRemoval[i];
            if (newIndex != RemovedField) {
              newFields[newIndex] = newFields[i];
            } else {
              removed++;
            }
          }
          newFields.resize(newFields.size() - removed);

          // Update field names as well. The Type Rewriter cannot do this for
          // us, as it does not know which old fields map to which new ones (it
          // just keeps the names in sequence).
          auto iter = wasm.typeNames.find(oldStructType);
          if (iter != wasm.typeNames.end()) {
            auto& nameInfo = iter->second;

            // Make a copy of the old ones to base ourselves off of as we do so.
            auto oldFieldNames = nameInfo.fieldNames;

            // Clear the old names and write the new ones.
            nameInfo.fieldNames.clear();
            for (Index i = 0; i < oldFieldNames.size(); i++) {
              auto newIndex = indexesAfterRemoval[i];
              if (newIndex != RemovedField && oldFieldNames.count(i)) {
                assert(oldFieldNames[i].is());
                nameInfo.fieldNames[newIndex] = oldFieldNames[i];
              }
            }
          }
        }
      }